

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O3

void __thiscall
CaDiCaL::heap<CaDiCaL::score_smaller>::exchange(heap<CaDiCaL::score_smaller> *this,uint a,uint b)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)a;
  this_00 = &this->pos;
  puVar6 = (this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
  if (uVar4 <= uVar8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,uVar8 + 1,&invalid_heap_position);
    puVar6 = (this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
  }
  uVar7 = (ulong)b;
  puVar5 = puVar6;
  if (uVar4 <= uVar7) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,uVar7 + 1,&invalid_heap_position);
    puVar5 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  puVar3 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = puVar5[uVar7];
  uVar2 = puVar3[puVar6[uVar8]];
  puVar3[puVar6[uVar8]] = puVar3[uVar1];
  puVar3[uVar1] = uVar2;
  uVar1 = puVar6[uVar8];
  puVar6[uVar8] = puVar5[uVar7];
  puVar5[uVar7] = uVar1;
  return;
}

Assistant:

void exchange (unsigned a, unsigned b) {
    unsigned &i = index (a), &j = index (b);
    swap (array[i], array[j]);
    swap (i, j);
  }